

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O0

wchar_t acl_special(archive_acl *acl,wchar_t type,wchar_t permset,wchar_t tag)

{
  wchar_t tag_local;
  wchar_t permset_local;
  wchar_t type_local;
  archive_acl *acl_local;
  
  if ((type == L'Ā') && ((permset & 0xfffffff8U) == 0)) {
    if (tag == L'✒') {
      acl->mode = acl->mode & 0xfffffe3f;
      acl->mode = (permset & 7U) << 6 | acl->mode;
      return L'\0';
    }
    if (tag == L'✔') {
      acl->mode = acl->mode & 0xffffffc7;
      acl->mode = (permset & 7U) << 3 | acl->mode;
      return L'\0';
    }
    if (tag == L'✖') {
      acl->mode = acl->mode & 0xfffffff8;
      acl->mode = permset & 7U | acl->mode;
      return L'\0';
    }
  }
  return L'\x01';
}

Assistant:

static int
acl_special(struct archive_acl *acl, int type, int permset, int tag)
{
	if (type == ARCHIVE_ENTRY_ACL_TYPE_ACCESS
	    && ((permset & ~007) == 0)) {
		switch (tag) {
		case ARCHIVE_ENTRY_ACL_USER_OBJ:
			acl->mode &= ~0700;
			acl->mode |= (permset & 7) << 6;
			return (0);
		case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
			acl->mode &= ~0070;
			acl->mode |= (permset & 7) << 3;
			return (0);
		case ARCHIVE_ENTRY_ACL_OTHER:
			acl->mode &= ~0007;
			acl->mode |= permset & 7;
			return (0);
		}
	}
	return (1);
}